

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_file.c
# Opt level: O3

size_t qc_file_read(QcFile *file,void *buf,size_t nbytes)

{
  int iVar1;
  size_t sVar2;
  int __whence;
  size_t __n;
  stat sStack_c0;
  
  if (file != (QcFile *)0x0) {
    sVar2 = read(file->filedes,buf,nbytes);
    return sVar2;
  }
  qc_file_read_cold_1();
  if (file != (QcFile *)0x0) {
    sVar2 = write(file->filedes,buf,__n);
    return sVar2;
  }
  qc_file_write_cold_1();
  if (file != (QcFile *)0x0) {
    iVar1 = fsync(file->filedes);
    if (iVar1 == 0) {
      sVar2 = 0;
    }
    else {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x83,"file sync failed");
      sVar2 = 0xffffffff;
    }
    return sVar2;
  }
  qc_file_sync_cold_1();
  if (file != (QcFile *)0x0) {
    sVar2 = lseek(file->filedes,(__off_t)buf,__whence);
    if ((long)sVar2 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0x94,"file seek failed");
      sVar2 = 0xffffffffffffffff;
    }
    return sVar2;
  }
  qc_file_seek_cold_1();
  if (file != (QcFile *)0x0) {
    sVar2 = lseek(file->filedes,0,1);
    if ((long)sVar2 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_file.c"
                ,0xa5,"file tell failed");
      sVar2 = 0xffffffffffffffff;
    }
    return sVar2;
  }
  qc_file_tell_cold_1();
  if (file != (QcFile *)0x0) {
    sStack_c0.__unused[2] = 0x10771d;
    iVar1 = access((char *)file,0);
    return (ulong)-(uint)(iVar1 != 0);
  }
  sStack_c0.__unused[2] = (long)qc_file_size;
  qc_file_exist_cold_1();
  iVar1 = stat((char *)file,&sStack_c0);
  sVar2 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    sVar2 = sStack_c0.st_size;
  }
  return sVar2;
}

Assistant:

size_t qc_file_read(QcFile *file, void *buf, size_t nbytes)
{
    size_t ssz;

    qc_assert(file);
    
    ssz = read(file->filedes, buf, nbytes);
    if(ssz < 0)
    {
        qc_error("file read failed");
        return -1;
    }

    return ssz;
}